

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Print.cpp
# Opt level: O3

void __thiscall
wasm::PrintExpressionContents::visitMemoryGrow(PrintExpressionContents *this,MemoryGrow *curr)

{
  ostream *stream;
  Module *in_R8;
  Name name;
  
  stream = this->o;
  Colors::outputColorCode(stream,"\x1b[35m");
  Colors::outputColorCode(stream,"\x1b[1m");
  std::__ostream_insert<char,std::char_traits<char>>(stream,"memory.grow",0xb);
  Colors::outputColorCode(stream,"\x1b[0m");
  name.super_IString.str._M_str = (char *)this->o;
  name.super_IString.str._M_len = (size_t)(curr->memory).super_IString.str._M_str;
  anon_unknown_0::printMemoryName
            ((anon_unknown_0 *)(curr->memory).super_IString.str._M_len,name,(ostream *)this->wasm,
             in_R8);
  return;
}

Assistant:

void visitMemoryGrow(MemoryGrow* curr) {
    printMedium(o, "memory.grow");
    printMemoryName(curr->memory, o, wasm);
  }